

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases)

{
  TestContext *pTVar1;
  TexFuncCaseSpec *pTVar2;
  TestCaseGroup *pTVar3;
  TestNode *node;
  ShaderTextureFunctionCase *pSVar4;
  undefined8 uVar5;
  deUint32 *pdVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  allocator<char> local_f9;
  ShaderTextureFunctionCase *local_f8;
  TestNode *local_f0;
  deUint32 *local_e8;
  TestNode *local_e0;
  TextureLookupSpec *local_d8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  TexFuncCaseSpec *local_80;
  ulong local_78;
  string local_70;
  string name;
  
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  local_f0 = &parent->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,(parent->super_TestNode).m_testCtx,groupName,groupDesc);
  uVar8 = 0;
  uVar7 = (ulong)(uint)numCases;
  if (numCases < 1) {
    uVar7 = uVar8;
  }
  pdVar6 = &cases->flags;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  local_80 = cases;
  do {
    pTVar2 = local_80;
    pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    bVar9 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar9) {
      group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
           = (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(local_f0,&pTVar3->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,((TexFuncCaseSpec *)(pdVar6 + -0x36))->name,
               (allocator<char> *)&local_c0);
    pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    local_d8 = (TextureLookupSpec *)(pdVar6 + -0x34);
    local_e8 = pdVar6;
    local_78 = uVar8;
    if (((((TextureLookupSpec *)(pdVar6 + -0x34))->function - FUNCTION_TEXTUREPROJGRAD < 3) ||
        ((((TextureLookupSpec *)(pdVar6 + -0x34))->function & ~FUNCTION_TEXTURELOD) -
         FUNCTION_TEXTUREPROJ < 3)) ||
       ((((TextureSpec *)(pdVar6 + -0x18))->type < TEXTURETYPE_LAST &&
        ((0x51U >> (((TextureSpec *)(pdVar6 + -0x18))->type & 0x1f) & 1) != 0)))) {
      if ((*pdVar6 & 1) != 0) {
        pdVar6 = &pTVar2[uVar8].flags;
        local_e0 = (TestNode *)((ulong)local_e0 & 0xffffffff00000000);
        goto LAB_00618528;
      }
      if ((*pdVar6 & 2) == 0) goto LAB_00618756;
LAB_006186b5:
      pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr;
      pSVar4 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
      pTVar1 = local_f0->m_testCtx;
      std::operator+(&local_c0,&name,"_fragment");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"",(allocator<char> *)&local_70);
      ShaderTextureFunctionCase::ShaderTextureFunctionCase
                (pSVar4,pTVar1,&local_c0,&local_a0,local_d8,(TextureSpec *)(local_e8 + -0x18),
                 *(TexEvalFunc *)(local_e8 + -2),false);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar4);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else if ((*pdVar6 & 1) == 0) {
      if ((*pdVar6 & 2) != 0) {
LAB_006185f9:
        pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr;
        node = (TestNode *)operator_new(0x1d8);
        pTVar1 = local_f0->m_testCtx;
        std::operator+(&local_a0,"sparse_",&name);
        std::operator+(&local_c0,&local_a0,"_fragment");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_f9);
        SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                  ((SparseShaderTextureFunctionCase *)node,pTVar1,&local_c0,&local_70,local_d8,
                   (TextureSpec *)(local_e8 + -0x18),*(TexEvalFunc *)(local_e8 + -2),false);
        tcu::TestNode::addChild(&pTVar3->super_TestNode,node);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_a0);
        goto LAB_006186b5;
      }
    }
    else {
      local_f8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
      pTVar1 = local_f0->m_testCtx;
      std::operator+(&local_a0,"sparse_",&name);
      std::operator+(&local_c0,&local_a0,"_vertex");
      local_e0 = &pTVar3->super_TestNode;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_f9);
      pdVar6 = local_e8;
      pSVar4 = local_f8;
      SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                ((SparseShaderTextureFunctionCase *)local_f8,pTVar1,&local_c0,&local_70,local_d8,
                 (TextureSpec *)(local_e8 + -0x18),*(TexEvalFunc *)(local_e8 + -2),true);
      tcu::TestNode::addChild(local_e0,(TestNode *)pSVar4);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_c0);
      uVar5 = std::__cxx11::string::~string((string *)&local_a0);
      local_e0 = (TestNode *)CONCAT44(local_e0._4_4_,(int)CONCAT71((int7)((ulong)uVar5 >> 8),1));
LAB_00618528:
      pTVar3 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr;
      local_f8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
      pTVar1 = local_f0->m_testCtx;
      std::operator+(&local_c0,&name,"_vertex");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"",(allocator<char> *)&local_70);
      pSVar4 = local_f8;
      ShaderTextureFunctionCase::ShaderTextureFunctionCase
                (local_f8,pTVar1,&local_c0,&local_a0,local_d8,(TextureSpec *)(local_e8 + -0x18),
                 *(TexEvalFunc *)(local_e8 + -2),true);
      tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pSVar4);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      if ((*pdVar6 & 2) != 0) {
        if ((char)local_e0 != '\0') goto LAB_006185f9;
        goto LAB_006186b5;
      }
    }
LAB_00618756:
    std::__cxx11::string::~string((string *)&name);
    uVar8 = local_78 + 1;
    pdVar6 = local_e8 + 0x38;
  } while( true );
}

Assistant:

static void createCaseGroup (tcu::TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc));

	for (int ndx = 0; ndx < numCases; ndx++)
	{
		std::string	name			= cases[ndx].name;
		bool		sparseSupported	= !functionHasProj(cases[ndx].lookupSpec.function)		&&
									  TEXTURETYPE_1D			!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_1D_ARRAY		!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_CUBE_ARRAY	!= cases[ndx].texSpec.type;

		if (cases[ndx].flags & VERTEX)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));
		}

		if (cases[ndx].flags & FRAGMENT)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));
		}
	}

	parent->addChild(group.release());
}